

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O3

Vector2d __thiscall
VehicleState::Propagator::GetRangeAndRate(Propagator *this,Vector3d *pos_station_ecef,double tof)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double *in_RDX;
  long lVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Vector2d VVar20;
  Vector3d vel_station_pef;
  Vector3d accel_station_pef;
  Matrix3d R_ecef2eci;
  double dStack_2a0;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_290;
  double local_278;
  double dStack_270;
  double local_268;
  double local_260;
  double local_258;
  double dStack_250;
  double local_248;
  double local_240;
  double dStack_238;
  double local_230;
  double local_228;
  double dStack_220;
  double local_218;
  double local_208;
  double dStack_200;
  double local_1f8 [6];
  double dStack_1c8;
  double local_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  undefined1 local_128 [16];
  double local_118;
  double dStack_110;
  double local_108;
  Matrix3d local_f8;
  Matrix3d local_a8;
  Matrix3d local_60;
  
  local_128._8_4_ = in_XMM0_Dc;
  local_128._0_8_ = tof;
  local_128._12_4_ = in_XMM0_Dd;
  dVar15 = pos_station_ecef[0xb].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
  dVar17 = pos_station_ecef[0xb].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
  dVar16 = pos_station_ecef[8].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
  local_148 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
              m_storage.m_data.array[1];
  dStack_140 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
               m_storage.m_data.array[2];
  local_268 = pos_station_ecef[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
  local_138 = pos_station_ecef[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1];
  dStack_130 = pos_station_ecef[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
  local_260 = pos_station_ecef[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
  local_290.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x120);
  local_290.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_290.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  lVar14 = 0;
  do {
    *(undefined8 *)
     ((long)((local_290.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar14) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_290.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar14 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_290.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar14 + 0x18) = 0;
    *(undefined8 *)
     ((long)((local_290.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar14 + 0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_290.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar14 + 0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_290.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar14 + 0x38) = 0;
    *(undefined8 *)
     ((long)((local_290.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar14 + 0x40) = 0x3ff0000000000000;
    lVar14 = lVar14 + 0x48;
  } while (lVar14 != 0x120);
  local_290.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_290.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  dVar19 = pos_station_ecef[10].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
  Util::ECEF2ECI(&local_f8,dVar15 + dVar17 / 86400.0,*(MatrixXd **)((long)dVar19 + 0x70),
                 *(MatrixXd **)((long)dVar19 + 0x78),&local_290);
  dVar19 = *in_RDX;
  dVar18 = in_RDX[1];
  dVar7 = in_RDX[2];
  local_278 = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[8] * dVar7 +
              dVar18 * local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[5];
  dStack_200 = dVar16 * (local_290.
                         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[6] * dVar7 +
                        local_290.
                        super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[3] * dVar18 +
                        local_290.
                        super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[0] * dVar19);
  local_208 = -dVar16 * (local_290.
                         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[7] * dVar7 +
                        local_290.
                        super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[4] * dVar18 +
                        local_290.
                        super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[1] * dVar19);
  local_1f8[0] = 0.0;
  dStack_110 = dVar16 * local_208;
  local_158 = 0.0 - dVar16 * dStack_200;
  local_108 = dStack_200 * 0.0 + local_208 * -0.0;
  uStack_150 = 0;
  dVar6 = ((local_290.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0];
  dVar8 = ((local_290.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1];
  dVar9 = ((local_290.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3];
  dVar10 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4];
  dVar11 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6];
  dVar4 = ((local_290.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7];
  dVar15 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8];
  dVar17 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2];
  dVar16 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5];
  lVar14 = 0x10;
  local_118 = local_158;
  do {
    dVar3 = *(double *)
             ((long)local_290.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar14);
    pdVar2 = (double *)
             ((long)((local_290.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar14 + 0x38);
    dVar12 = *pdVar2;
    dVar13 = pdVar2[1];
    *(double *)((long)local_1f8 + lVar14) = dVar13 * dVar9 + dVar12 * dVar6 + dVar3 * dVar11;
    *(double *)((long)local_1f8 + lVar14 + 8) = dVar13 * dVar10 + dVar12 * dVar8 + dVar3 * dVar4;
    *(double *)((long)local_1f8 + lVar14 + 0x10) =
         dVar16 * dVar13 + dVar3 * dVar15 + dVar17 * dVar12;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x58);
  lVar14 = 0;
  do {
    dVar15 = *(double *)
              ((long)local_290.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + lVar14 + 0x10);
    pdVar2 = (double *)
             ((long)local_290.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar14);
    dVar17 = *pdVar2;
    dVar16 = pdVar2[1];
    *(double *)
     ((long)local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar14) = dVar16 * local_1f8[5] + dVar17 * local_1f8[2] + dVar15 * local_1b8;
    *(double *)
     ((long)local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar14 + 8) = dVar16 * dStack_1c8 + dVar17 * local_1f8[3] + dVar15 * dStack_1b0;
    *(double *)
     ((long)local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar14 + 0x10) = local_1c0 * dVar16 + dVar15 * local_1a8 + local_1f8[4] * dVar17
    ;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x48);
  Util::OrthoNormMat(&local_60);
  dVar6 = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] * dVar7 +
          local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] * dVar19 +
          local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] * dVar18;
  dVar15 = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7] * dVar7 +
           local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] * dVar19 +
           local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] * dVar18;
  auVar5._8_4_ = SUB84(dVar15,0);
  auVar5._0_8_ = dVar6;
  auVar5._12_4_ = (int)((ulong)dVar15 >> 0x20);
  dVar19 = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] * dVar19 + local_278;
  local_278 = local_228 * local_1f8[0];
  dStack_270 = dStack_220 * local_1f8[0];
  local_178 = local_1f8[0] * local_218 + dStack_200 * local_230;
  dStack_170 = local_1f8[0];
  dVar18 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0];
  dVar7 = ((local_290.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1];
  dVar8 = ((local_290.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3];
  dVar9 = ((local_290.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4];
  dVar10 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6];
  dVar11 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7];
  dVar15 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8];
  dVar17 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2];
  dVar16 = ((local_290.
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5];
  lVar14 = 0x10;
  do {
    dVar4 = *(double *)
             ((long)local_290.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar14);
    pdVar2 = (double *)
             ((long)((local_290.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar14 + 0x38);
    dVar3 = *pdVar2;
    dVar12 = pdVar2[1];
    *(double *)((long)local_1f8 + lVar14) = dVar12 * dVar8 + dVar3 * dVar18 + dVar4 * dVar10;
    *(double *)((long)local_1f8 + lVar14 + 8) = dVar12 * dVar9 + dVar3 * dVar7 + dVar4 * dVar11;
    *(double *)((long)local_1f8 + lVar14 + 0x10) = dVar16 * dVar12 + dVar4 * dVar15 + dVar17 * dVar3
    ;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x58);
  local_168 = local_258 * local_208 + dStack_200 * local_240;
  dStack_160 = dStack_250 * local_208 + dStack_200 * dStack_238;
  dVar15 = local_248 * local_208;
  lVar14 = 0;
  do {
    dVar17 = *(double *)
              ((long)local_290.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + lVar14 + 0x10);
    pdVar2 = (double *)
             ((long)local_290.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar14);
    dVar16 = *pdVar2;
    dVar18 = pdVar2[1];
    *(double *)
     ((long)local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar14) = dVar18 * local_1f8[5] + dVar16 * local_1f8[2] + dVar17 * local_1b8;
    *(double *)
     ((long)local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar14 + 8) = dVar18 * dStack_1c8 + dVar16 * local_1f8[3] + dVar17 * dStack_1b0;
    *(double *)
     ((long)local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar14 + 0x10) = local_1c0 * dVar18 + dVar17 * local_1a8 + local_1f8[4] * dVar16
    ;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x48);
  Util::OrthoNormMat(&local_a8);
  dVar15 = dVar15 + local_178;
  dStack_2a0 = auVar5._8_8_;
  dVar17 = (double)local_128._0_8_ * (local_278 + local_168) + (local_148 - dVar6);
  dVar18 = (double)local_128._0_8_ * (dStack_270 + dStack_160) + (dStack_140 - dStack_2a0);
  dVar19 = dVar15 * (double)local_128._0_8_ + (local_268 - dVar19);
  dVar16 = ((double)local_128._0_8_ *
            (local_228 * local_108 + dStack_110 * local_240 + local_158 * local_258) +
           (local_138 - (local_278 + local_168))) * dVar17;
  dVar17 = SQRT(dVar19 * dVar19 + dVar18 * dVar18 + dVar17 * dVar17);
  *(double *)this = dVar17;
  dVar17 = (((local_108 * local_218 + dStack_110 * local_230 + local_158 * local_248) *
             (double)local_128._0_8_ + (local_260 - dVar15)) * dVar19 +
           ((double)local_128._0_8_ *
            (dStack_220 * local_108 + dStack_110 * dStack_238 + local_158 * dStack_250) +
           (dStack_130 - (dStack_270 + dStack_160))) * dVar18 + dVar16) / dVar17;
  (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = dVar17;
  if (local_290.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_290.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    dVar17 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  VVar20.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       dVar16;
  VVar20.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       dVar17;
  return (Vector2d)
         VVar20.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

Eigen::Vector2d Propagator::GetRangeAndRate(Eigen::Vector3d pos_station_ecef, double tof){

		//locals
		double JD_UTC = this->t_JD_ + this->t_/(24.0*60.0*60.0); //current UTC Julian Date in days
		double earthrot = this->earthrotationspeed_;
		Eigen::Vector3d pos_craft = this->pos_;
		Eigen::Vector3d vel_craft = this->vel_;
		std::vector<Eigen::Matrix3d> matvec(4, Eigen::Matrix3d::Identity(3,3));
		Eigen::Matrix3d R_ecef2eci = Util::ECEF2ECI(JD_UTC, this->gravmodel_->nut80ptr_, this->gravmodel_->iau1980ptr_, &matvec); //matrix rotating from ECEF2ECI


		//convert station position to ECI
		Eigen::Vector3d pos_station = R_ecef2eci*pos_station_ecef;

		//initialize measurement
		Eigen::Vector2d z;

		//station ECI velocity
		// Eigen::Vector3d vel_station;
		// vel_station[0] = -1.0*earthrot*pos_station[1];
		// vel_station[1] = earthrot*pos_station[0];
		// vel_station[2] = 0.0;

		// std::cout << "vel1: \n" << vel_station << "\n";

		// Vallado IAU-76/FK5 transformation for velocity
		//convert station position to PEF 
		Eigen::Vector3d pos_station_pef = matvec[3]*pos_station_ecef;

		//modify earth rate
		double LOD = matvec[4](0,0);
		// earthrot = earthrot*(1.0 - LOD/86400.0);
		Eigen::Vector3d earthrot_vec{0.0, 0.0, earthrot};

		//station PEF velocity
		Eigen::Vector3d vel_station_pef;
		vel_station_pef[0] = -1.0*earthrot*pos_station_pef[1];
		vel_station_pef[1] = earthrot*pos_station_pef[0];
		vel_station_pef[2] = 0.0;

		// //station PEF acceleration
		// Eigen::Vector3d accel_station_pef;
		// accel_station_pef[0] = -1.0*earthrot*earthrot*pos_station_pef[0];
		// accel_station_pef[1] = -1.0*earthrot*earthrot*pos_station_pef[1];
		// accel_station_pef[2] = 0.0;

		// std::cout << accel_station_pef << "\n";

		//station PEF acceleration with a different method specified by vallado
		Eigen::Vector3d accel_station_pef = 1.0*earthrot_vec.cross(vel_station_pef);

		// std::cout << accel_station_pef2 << "\n";

		// exit(0);

		//station ECI velocity
		Eigen::Vector3d vel_station_eci = Util::OrthoNormMat(matvec[0]*matvec[1]*matvec[2])*vel_station_pef;

		//stations ECI accel
		Eigen::Vector3d accel_station_eci = Util::OrthoNormMat(matvec[0]*matvec[1]*matvec[2])*accel_station_pef;

		// std::cout << "vel2: \n" << R_ecef2eci*vel_station_ecef << "\n";

		// exit(0);

		//relative position and velocity
		Eigen::Vector3d rel_pos = pos_craft - pos_station + tof*vel_station_eci;
		Eigen::Vector3d rel_vel  = vel_craft - vel_station_eci + tof*accel_station_eci;

		// std::cout << "Aberation position correction: " << (tof*vel_station_eci).norm() << "\n";
		// exit(0);

		//range
		z[0] = rel_pos.norm();

		//range rate
		z[1] = rel_pos.dot(rel_vel)/z[0];

		return z;

	}